

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O3

int BN_bn2mpi(BIGNUM *a,uchar *to)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  
  uVar1 = BN_num_bits(a);
  uVar2 = (ulong)((uVar1 & 7) == 0 && uVar1 != 0);
  lVar3 = ((ulong)uVar1 + 7 >> 3) + uVar2;
  uVar1 = (uint)lVar3;
  if (to != (uchar *)0x0) {
    *(uint *)to = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (uVar2 != 0) {
      to[4] = '\0';
    }
    BN_bn2bin(a,to + uVar2 + 4);
    if ((a->neg != 0) && (lVar3 != 0)) {
      to[4] = to[4] | 0x80;
    }
  }
  return uVar1 + 4;
}

Assistant:

size_t BN_bn2mpi(const BIGNUM *in, uint8_t *out) {
  const size_t bits = BN_num_bits(in);
  const size_t bytes = (bits + 7) / 8;
  // If the number of bits is a multiple of 8, i.e. if the MSB is set,
  // prefix with a zero byte.
  int extend = 0;
  if (bytes != 0 && (bits & 0x07) == 0) {
    extend = 1;
  }

  const size_t len = bytes + extend;
  if (len < bytes || 4 + len < len || (len & 0xffffffff) != len) {
    // If we cannot represent the number then we emit zero as the interface
    // doesn't allow an error to be signalled.
    if (out) {
      OPENSSL_memset(out, 0, 4);
    }
    return 4;
  }

  if (out == NULL) {
    return 4 + len;
  }

  out[0] = len >> 24;
  out[1] = len >> 16;
  out[2] = len >> 8;
  out[3] = len;
  if (extend) {
    out[4] = 0;
  }
  BN_bn2bin(in, out + 4 + extend);
  if (in->neg && len > 0) {
    out[4] |= 0x80;
  }
  return len + 4;
}